

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_list.c
# Opt level: O0

OPJ_BOOL opj_procedure_list_add_procedure
                   (opj_procedure_list_t *p_validation_list,opj_procedure p_procedure,
                   opj_event_mgr_t *p_manager)

{
  opj_procedure *pp_Var1;
  opj_procedure *new_procedures;
  opj_event_mgr_t *p_manager_local;
  opj_procedure p_procedure_local;
  opj_procedure_list_t *p_validation_list_local;
  
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/function_list.c"
                  ,0x4a,
                  "OPJ_BOOL opj_procedure_list_add_procedure(opj_procedure_list_t *, opj_procedure, opj_event_mgr_t *)"
                 );
  }
  if (p_validation_list->m_nb_max_procedures == p_validation_list->m_nb_procedures) {
    p_validation_list->m_nb_max_procedures = p_validation_list->m_nb_max_procedures + 10;
    pp_Var1 = (opj_procedure *)
              opj_realloc(p_validation_list->m_procedures,
                          (ulong)p_validation_list->m_nb_max_procedures << 3);
    if (pp_Var1 == (opj_procedure *)0x0) {
      opj_free(p_validation_list->m_procedures);
      p_validation_list->m_nb_max_procedures = 0;
      p_validation_list->m_nb_procedures = 0;
      opj_event_msg(p_manager,1,"Not enough memory to add a new validation procedure\n");
      return 0;
    }
    p_validation_list->m_procedures = pp_Var1;
  }
  p_validation_list->m_procedures[p_validation_list->m_nb_procedures] = p_procedure;
  p_validation_list->m_nb_procedures = p_validation_list->m_nb_procedures + 1;
  return 1;
}

Assistant:

OPJ_BOOL opj_procedure_list_add_procedure(opj_procedure_list_t *
        p_validation_list, opj_procedure p_procedure, opj_event_mgr_t* p_manager)
{

    assert(p_manager != NULL);

    if (p_validation_list->m_nb_max_procedures ==
            p_validation_list->m_nb_procedures) {
        opj_procedure * new_procedures;

        p_validation_list->m_nb_max_procedures += OPJ_VALIDATION_SIZE;
        new_procedures = (opj_procedure*)opj_realloc(
                             p_validation_list->m_procedures,
                             p_validation_list->m_nb_max_procedures * sizeof(opj_procedure));
        if (! new_procedures) {
            opj_free(p_validation_list->m_procedures);
            p_validation_list->m_nb_max_procedures = 0;
            p_validation_list->m_nb_procedures = 0;
            opj_event_msg(p_manager, EVT_ERROR,
                          "Not enough memory to add a new validation procedure\n");
            return OPJ_FALSE;
        } else {
            p_validation_list->m_procedures = new_procedures;
        }
    }
    p_validation_list->m_procedures[p_validation_list->m_nb_procedures] =
        p_procedure;
    ++p_validation_list->m_nb_procedures;

    return OPJ_TRUE;
}